

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

void __thiscall wasm::Tuple::validate(Tuple *this)

{
  pointer pTVar1;
  char cVar2;
  pointer pTVar3;
  Type type;
  
  pTVar3 = (this->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (this->types).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pTVar3 == pTVar1) {
      return;
    }
    if ((pTVar3->id < 2) || (cVar2 = ::wasm::Type::isTuple(), cVar2 != '\0')) break;
    pTVar3 = pTVar3 + 1;
  }
  __assert_fail("type.isSingle()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                ,0x1e6,"void wasm::Tuple::validate()");
}

Assistant:

void validate() {
#ifndef NDEBUG
    for (auto type : types) {
      assert(type.isSingle());
    }
#endif
  }